

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockParameterTest.cpp
# Opt level: O0

void __thiscall
TEST_MockParameterTest_twoDifferentOutputParametersInSameFunctionCallSucceeds_Test::testBody
          (TEST_MockParameterTest_twoDifferentOutputParametersInSameFunctionCallSucceeds_Test *this)

{
  int iVar1;
  MockSupport *pMVar2;
  undefined4 extraout_var;
  long *plVar3;
  undefined4 extraout_var_00;
  UtestShell *pUVar4;
  char *pcVar5;
  char *pcVar6;
  TestTerminator *pTVar7;
  SimpleString local_140;
  SimpleString local_130;
  SimpleString local_120;
  SimpleString local_110;
  SimpleString local_100;
  SimpleString local_f0;
  SimpleString local_e0;
  SimpleString local_d0;
  SimpleString local_c0;
  SimpleString local_b0;
  SimpleString local_a0;
  SimpleString local_90;
  SimpleString local_80;
  SimpleString local_70;
  SimpleString local_60;
  SimpleString local_50 [2];
  SimpleString local_30;
  int local_20;
  int local_1c;
  int retval2;
  int retval1;
  int param2;
  int param1;
  TEST_MockParameterTest_twoDifferentOutputParametersInSameFunctionCallSucceeds_Test *this_local;
  
  retval1 = 1;
  retval2 = 1;
  local_1c = 2;
  local_20 = 3;
  _param2 = this;
  SimpleString::SimpleString(&local_30,"");
  pMVar2 = mock(&local_30,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(local_50,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[3])(pMVar2,local_50);
  SimpleString::SimpleString(&local_60,"bar");
  plVar3 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x30))
                             ((long *)CONCAT44(extraout_var,iVar1),&local_60,&local_1c,4);
  SimpleString::SimpleString(&local_70,"foobar");
  (**(code **)(*plVar3 + 0x30))(plVar3,&local_70,&local_20,4);
  SimpleString::~SimpleString(&local_70);
  SimpleString::~SimpleString(&local_60);
  SimpleString::~SimpleString(local_50);
  SimpleString::~SimpleString(&local_30);
  SimpleString::SimpleString(&local_80,"");
  pMVar2 = mock(&local_80,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_90,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_90);
  SimpleString::SimpleString(&local_a0,"bar");
  plVar3 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x28))
                             ((long *)CONCAT44(extraout_var_00,iVar1),&local_a0,&retval1);
  SimpleString::SimpleString(&local_b0,"foobar");
  (**(code **)(*plVar3 + 0x28))(plVar3,&local_b0,&retval2);
  SimpleString::~SimpleString(&local_b0);
  SimpleString::~SimpleString(&local_a0);
  SimpleString::~SimpleString(&local_90);
  SimpleString::~SimpleString(&local_80);
  if (local_1c == 2) {
    pUVar4 = UtestShell::getCurrent();
    pTVar7 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockParameterTest.cpp"
               ,0x2f8,pTVar7);
  }
  else {
    pUVar4 = UtestShell::getCurrent();
    ::StringFrom((int)&local_c0);
    pcVar5 = SimpleString::asCharString(&local_c0);
    ::StringFrom((int)&local_d0);
    pcVar6 = SimpleString::asCharString(&local_d0);
    pTVar7 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar5,pcVar6,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockParameterTest.cpp"
               ,0x2f8,pTVar7);
    SimpleString::~SimpleString(&local_d0);
    SimpleString::~SimpleString(&local_c0);
  }
  if (retval1 == 2) {
    pUVar4 = UtestShell::getCurrent();
    pTVar7 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockParameterTest.cpp"
               ,0x2f9,pTVar7);
  }
  else {
    pUVar4 = UtestShell::getCurrent();
    ::StringFrom((int)&local_e0);
    pcVar5 = SimpleString::asCharString(&local_e0);
    ::StringFrom((int)&local_f0);
    pcVar6 = SimpleString::asCharString(&local_f0);
    pTVar7 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar5,pcVar6,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockParameterTest.cpp"
               ,0x2f9,pTVar7);
    SimpleString::~SimpleString(&local_f0);
    SimpleString::~SimpleString(&local_e0);
  }
  if (local_20 == 3) {
    pUVar4 = UtestShell::getCurrent();
    pTVar7 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockParameterTest.cpp"
               ,0x2fa,pTVar7);
  }
  else {
    pUVar4 = UtestShell::getCurrent();
    ::StringFrom((int)&local_100);
    pcVar5 = SimpleString::asCharString(&local_100);
    ::StringFrom((int)&local_110);
    pcVar6 = SimpleString::asCharString(&local_110);
    pTVar7 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar5,pcVar6,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockParameterTest.cpp"
               ,0x2fa,pTVar7);
    SimpleString::~SimpleString(&local_110);
    SimpleString::~SimpleString(&local_100);
  }
  if (retval2 == 3) {
    pUVar4 = UtestShell::getCurrent();
    pTVar7 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockParameterTest.cpp"
               ,0x2fb,pTVar7);
  }
  else {
    pUVar4 = UtestShell::getCurrent();
    ::StringFrom((int)&local_120);
    pcVar5 = SimpleString::asCharString(&local_120);
    ::StringFrom((int)&local_130);
    pcVar6 = SimpleString::asCharString(&local_130);
    pTVar7 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar5,pcVar6,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockParameterTest.cpp"
               ,0x2fb,pTVar7);
    SimpleString::~SimpleString(&local_130);
    SimpleString::~SimpleString(&local_120);
  }
  SimpleString::SimpleString(&local_140,"");
  pMVar2 = mock(&local_140,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x25])();
  SimpleString::~SimpleString(&local_140);
  return;
}

Assistant:

TEST(MockParameterTest, twoDifferentOutputParametersInSameFunctionCallSucceeds)
{
    int param1 = 1;
    int param2 = 1;
    int retval1 = 2;
    int retval2 = 3;

    mock().expectOneCall("foo")
        .withOutputParameterReturning("bar", &retval1, sizeof(retval1))
        .withOutputParameterReturning("foobar", &retval2, sizeof(retval2));
    mock().actualCall("foo")
        .withOutputParameter("bar", &param1)
        .withOutputParameter("foobar", &param2);

    CHECK_EQUAL(2, retval1);
    CHECK_EQUAL(2, param1);
    CHECK_EQUAL(3, retval2);
    CHECK_EQUAL(3, param2);
    mock().checkExpectations();
}